

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

double __thiscall
HighsPseudocost::getPseudocostDown(HighsPseudocost *this,HighsInt col,double frac,double offset)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int in_ESI;
  HighsPseudocost *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double weightPs;
  double cost;
  double down;
  double local_50;
  double local_30;
  
  dVar4 = floor(in_XMM0_Qa);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesdown,(long)in_ESI);
  if (*pvVar2 != 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesdown,(long)in_ESI);
    if (in_RDI->minreliable <= *pvVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->pseudocostdown,(long)in_ESI);
      local_30 = *pvVar3;
      goto LAB_0060baac;
    }
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesdown,(long)in_ESI);
  if (*pvVar2 == 0) {
    local_50 = 0.0;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesdown,(long)in_ESI);
    local_50 = ((double)*pvVar2 * 0.1) / (double)in_RDI->minreliable + 0.9;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->pseudocostdown,(long)in_ESI);
  dVar1 = *pvVar3;
  dVar5 = getAvgPseudocost(in_RDI);
  local_30 = (1.0 - local_50) * dVar5 + local_50 * dVar1;
LAB_0060baac:
  return (in_XMM0_Qa - dVar4) * (in_XMM1_Qa + local_30);
}

Assistant:

double getPseudocostDown(HighsInt col, double frac, double offset) const {
    double down = frac - std::floor(frac);
    double cost;

    if (nsamplesdown[col] == 0 || nsamplesdown[col] < minreliable) {
      double weightPs = nsamplesdown[col] == 0
                            ? 0
                            : 0.9 + 0.1 * nsamplesdown[col] /
                                        static_cast<double>(minreliable);
      cost = weightPs * pseudocostdown[col];
      cost += (1.0 - weightPs) * getAvgPseudocost();
    } else
      cost = pseudocostdown[col];

    return down * (offset + cost);
  }